

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

void CECoordinates::CIRS2Galactic
               (double input_ra,double input_dec,double *glon,double *glat,CEDate *date,
               CEAngleType *angle_type)

{
  int *in_RCX;
  CEAngleType *in_RDX;
  CEDate *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double *in_XMM1_Qa;
  double unaff_retaddr;
  double ICRS_dec;
  double ICRS_ra;
  undefined4 uVar1;
  double *glon_00;
  double input_dec_00;
  
  if (*in_RCX == 0) {
    in_XMM0_Qa = in_XMM0_Qa * 0.017453292519943295;
    in_XMM1_Qa = (double *)((double)in_XMM1_Qa * 0.017453292519943295);
  }
  input_dec_00 = 0.0;
  glon_00 = (double *)0x0;
  uVar1 = 1;
  CIRS2ICRS(unaff_retaddr,in_XMM0_Qa,in_XMM1_Qa,in_RDI,in_RSI,in_RDX);
  ICRS2Galactic((double)in_RCX,input_dec_00,glon_00,(double *)CONCAT44(uVar1,1),
                (CEAngleType *)0x14a86a);
  if (*in_RCX == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    in_RSI->_vptr_CEDate = (_func_int **)((double)in_RSI->_vptr_CEDate * 57.29577951308232);
  }
  return;
}

Assistant:

void CECoordinates::CIRS2Galactic(double input_ra, double input_dec, double *glon, double *glat,
                                  const CEDate& date, const CEAngleType& angle_type)
{
    // Convert to radians if that's what is passed
    if (angle_type==CEAngleType::DEGREES) {
        input_ra  *= DD2R ;
        input_dec *= DD2R ;
    }
    
    // In order to do this with the sofa package, we must first
    // convert from CIRS -> ICRS
    double ICRS_ra(0.0), ICRS_dec(0.0) ;
    CIRS2ICRS(input_ra, input_dec, &ICRS_ra, &ICRS_dec, date, CEAngleType::RADIANS);
    
    // Now we can convert to galactic
    ICRS2Galactic(ICRS_ra, ICRS_dec, glon, glat, CEAngleType::RADIANS) ;
    
    // Convert to the desired units
    if (angle_type == CEAngleType::DEGREES) {
        *glon *= DR2D ;
        *glat *= DR2D ;
    }
}